

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Connector.cpp
# Opt level: O0

set<std::basic_string_view<char,_std::char_traits<char>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
* helics::apps::generateAliases
            (string_view target,
            unordered_multimap<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
            *aliases)

{
  ulong uVar1;
  _Node_iterator_base<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>,_true>
  *__x;
  bool bVar2;
  size_type sVar3;
  type_conflict *ptVar4;
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  *in_RCX;
  set<std::basic_string_view<char,_std::char_traits<char>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  *in_RDI;
  pair<std::_Rb_tree_const_iterator<std::basic_string_view<char,_std::char_traits<char>_>_>,_bool>
  pVar5;
  pair<std::__detail::_Node_const_iterator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>,_false,_true>,_std::__detail::_Node_const_iterator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>,_false,_true>_>
  pVar6;
  type_conflict *newAlias;
  type *iterator;
  type match_1;
  size_t cascadeIndex;
  type match;
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  matchList;
  type *last;
  type *first;
  set<std::basic_string_view<char,_std::char_traits<char>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  *matches;
  key_type *in_stack_fffffffffffffe78;
  undefined7 in_stack_fffffffffffffe80;
  undefined1 in_stack_fffffffffffffe87;
  _Rb_tree_const_iterator<std::basic_string_view<char,_std::char_traits<char>_>_>
  in_stack_fffffffffffffe88;
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  *in_stack_fffffffffffffe90;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_fffffffffffffe98;
  set<std::basic_string_view<char,_std::char_traits<char>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  *in_stack_fffffffffffffea0;
  _Node_iterator_base<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>,_true>
  local_d8 [3];
  pair<std::__detail::_Node_const_iterator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>,_false,_true>,_std::__detail::_Node_const_iterator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>,_false,_true>_>
  local_c0;
  ulong local_b0;
  _Base_ptr local_a8;
  undefined1 local_a0;
  _Node_iterator_base<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>,_true>
  local_98;
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  local_90;
  _Base_ptr local_78;
  undefined1 local_70;
  undefined4 local_64;
  _Node_iterator_base<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>,_true>
  local_60;
  _Node_iterator_base<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>,_true>
  *local_58;
  _Node_iterator_base<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>,_true>
  *local_50;
  pair<std::__detail::_Node_const_iterator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>,_false,_true>,_std::__detail::_Node_const_iterator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>,_false,_true>_>
  local_38;
  byte local_21;
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  *local_20;
  
  local_21 = 0;
  local_20 = in_RCX;
  CLI::std::
  set<std::basic_string_view<char,_std::char_traits<char>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ::set((set<std::basic_string_view<char,_std::char_traits<char>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
         *)0x2650c1);
  local_38 = CLI::std::
             unordered_multimap<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
             ::equal_range((unordered_multimap<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
                            *)CONCAT17(in_stack_fffffffffffffe87,in_stack_fffffffffffffe80),
                           in_stack_fffffffffffffe78);
  local_50 = &std::
              get<0ul,std::__detail::_Node_const_iterator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::basic_string_view<char,std::char_traits<char>>>,false,true>,std::__detail::_Node_const_iterator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::basic_string_view<char,std::char_traits<char>>>,false,true>>
                        ((pair<std::__detail::_Node_const_iterator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>,_false,_true>,_std::__detail::_Node_const_iterator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>,_false,_true>_>
                          *)0x265109)->
              super__Node_iterator_base<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>,_true>
  ;
  local_58 = &std::
              get<1ul,std::__detail::_Node_const_iterator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::basic_string_view<char,std::char_traits<char>>>,false,true>,std::__detail::_Node_const_iterator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::basic_string_view<char,std::char_traits<char>>>,false,true>>
                        ((pair<std::__detail::_Node_const_iterator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>,_false,_true>,_std::__detail::_Node_const_iterator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>,_false,_true>_>
                          *)0x26511e)->
              super__Node_iterator_base<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>,_true>
  ;
  __x = local_50;
  local_60._M_cur =
       (__node_type *)
       CLI::std::
       unordered_multimap<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
       ::end((unordered_multimap<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
              *)in_stack_fffffffffffffe78);
  bVar2 = CLI::std::__detail::operator==(__x,&local_60);
  if (bVar2) {
    local_21 = 1;
    local_64 = 1;
  }
  else {
    pVar5 = std::
            set<std::basic_string_view<char,std::char_traits<char>>,std::less<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
            ::emplace<std::basic_string_view<char,std::char_traits<char>>const&>
                      (in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
    local_78 = (_Base_ptr)pVar5.first._M_node;
    local_70 = pVar5.second;
    CLI::std::
    vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
    ::vector((vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
              *)0x2651d3);
    local_98._M_cur = local_50->_M_cur;
    while( true ) {
      bVar2 = CLI::std::__detail::operator==(&local_98,local_58);
      if (((bVar2 ^ 0xffU) & 1) == 0) break;
      CLI::std::__detail::
      _Node_const_iterator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>,_false,_true>
      ::operator->((_Node_const_iterator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>,_false,_true>
                    *)0x265213);
      pVar5 = std::
              set<std::basic_string_view<char,std::char_traits<char>>,std::less<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
              ::emplace<std::basic_string_view<char,std::char_traits<char>>const&>
                        (in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
      local_a8 = (_Base_ptr)pVar5.first._M_node;
      local_a0 = pVar5.second;
      CLI::std::__detail::
      _Node_const_iterator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>,_false,_true>
      ::operator->((_Node_const_iterator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>,_false,_true>
                    *)0x265254);
      std::
      vector<std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
      ::emplace_back<std::basic_string_view<char,std::char_traits<char>>const&>
                (in_stack_fffffffffffffe90,
                 (basic_string_view<char,_std::char_traits<char>_> *)
                 in_stack_fffffffffffffe88._M_node);
      CLI::std::__detail::
      _Node_const_iterator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>,_false,_true>
      ::operator++((_Node_const_iterator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>,_false,_true>
                    *)CONCAT17(in_stack_fffffffffffffe87,in_stack_fffffffffffffe80));
    }
    local_b0 = 1;
    while( true ) {
      uVar1 = local_b0;
      sVar3 = CLI::std::
              vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
              ::size(&local_90);
      if (sVar3 <= uVar1) break;
      in_stack_fffffffffffffe90 = local_20;
      CLI::std::
      vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
      ::operator[](&local_90,local_b0);
      pVar6 = CLI::std::
              unordered_multimap<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
              ::equal_range((unordered_multimap<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
                             *)CONCAT17(in_stack_fffffffffffffe87,in_stack_fffffffffffffe80),
                            in_stack_fffffffffffffe78);
      local_c0 = pVar6;
      std::
      tie<std::__detail::_Node_const_iterator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::basic_string_view<char,std::char_traits<char>>>,false,true>,std::__detail::_Node_const_iterator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::basic_string_view<char,std::char_traits<char>>>,false,true>>
                ((_Node_const_iterator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>,_false,_true>
                  *)in_stack_fffffffffffffe88._M_node,
                 (_Node_const_iterator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>,_false,_true>
                  *)CONCAT17(in_stack_fffffffffffffe87,in_stack_fffffffffffffe80));
      std::
      tuple<std::__detail::_Node_const_iterator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::basic_string_view<char,std::char_traits<char>>>,false,true>&,std::__detail::_Node_const_iterator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::basic_string_view<char,std::char_traits<char>>>,false,true>&>
      ::operator=((tuple<std::__detail::_Node_const_iterator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>,_false,_true>_&,_std::__detail::_Node_const_iterator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>,_false,_true>_&>
                   *)in_stack_fffffffffffffe90,
                  (pair<std::__detail::_Node_const_iterator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>,_false,_true>,_std::__detail::_Node_const_iterator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>,_false,_true>_>
                   *)in_stack_fffffffffffffe88._M_node);
      local_d8[0]._M_cur = local_50->_M_cur;
      while( true ) {
        bVar2 = CLI::std::__detail::operator==(local_d8,local_58);
        if (((bVar2 ^ 0xffU) & 1) == 0) break;
        CLI::std::__detail::
        _Node_const_iterator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>,_false,_true>
        ::operator->((_Node_const_iterator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>,_false,_true>
                      *)0x2653a2);
        pVar5 = std::
                set<std::basic_string_view<char,std::char_traits<char>>,std::less<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
                ::emplace<std::basic_string_view<char,std::char_traits<char>>const&>
                          ((set<std::basic_string_view<char,_std::char_traits<char>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                            *)pVar6.first.
                              super__Node_iterator_base<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>,_true>
                              ._M_cur.
                              super__Node_iterator_base<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>,_true>
                           ,(basic_string_view<char,_std::char_traits<char>_> *)
                            pVar6.second.
                            super__Node_iterator_base<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>,_true>
                            ._M_cur.
                            super__Node_iterator_base<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>,_true>
                          );
        in_stack_fffffffffffffe88 = pVar5.first._M_node;
        in_stack_fffffffffffffe87 = pVar5.second;
        std::
        get<0ul,std::_Rb_tree_const_iterator<std::basic_string_view<char,std::char_traits<char>>>,bool>
                  ((pair<std::_Rb_tree_const_iterator<std::basic_string_view<char,_std::char_traits<char>_>_>,_bool>
                    *)0x265401);
        ptVar4 = std::
                 get<1ul,std::_Rb_tree_const_iterator<std::basic_string_view<char,std::char_traits<char>>>,bool>
                           ((pair<std::_Rb_tree_const_iterator<std::basic_string_view<char,_std::char_traits<char>_>_>,_bool>
                             *)0x265416);
        if ((*ptVar4 & 1U) != 0) {
          CLI::std::__detail::
          _Node_const_iterator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>,_false,_true>
          ::operator->((_Node_const_iterator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>,_false,_true>
                        *)0x265438);
          std::
          vector<std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
          ::emplace_back<std::basic_string_view<char,std::char_traits<char>>const&>
                    (in_stack_fffffffffffffe90,
                     (basic_string_view<char,_std::char_traits<char>_> *)
                     in_stack_fffffffffffffe88._M_node);
        }
        CLI::std::__detail::
        _Node_const_iterator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>,_false,_true>
        ::operator++((_Node_const_iterator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>,_false,_true>
                      *)CONCAT17(in_stack_fffffffffffffe87,in_stack_fffffffffffffe80));
      }
      local_b0 = local_b0 + 1;
    }
    local_21 = 1;
    local_64 = 1;
    CLI::std::
    vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
    ::~vector(in_stack_fffffffffffffe90);
  }
  if ((local_21 & 1) == 0) {
    CLI::std::
    set<std::basic_string_view<char,_std::char_traits<char>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
    ::~set((set<std::basic_string_view<char,_std::char_traits<char>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
            *)0x2654b1);
  }
  return in_RDI;
}

Assistant:

static std::set<std::string_view>
    generateAliases(const std::string_view target,
                    const std::unordered_multimap<std::string_view, std::string_view>& aliases)
{
    std::set<std::string_view> matches;
    auto [first, last] = aliases.equal_range(target);
    if (first == aliases.end()) {
        return matches;
    }
    matches.emplace(target);
    std::vector<std::string_view> matchList;
    for (auto match = first; match != last; ++match) {
        matches.emplace(match->second);
        matchList.emplace_back(match->second);
    }
    std::size_t cascadeIndex{1};
    while (cascadeIndex < matchList.size()) {
        std::tie(first, last) = aliases.equal_range(matchList[cascadeIndex]);
        for (auto match = first; match != last; ++match) {
            auto [iterator, newAlias] = matches.emplace(match->second);
            if (newAlias) {
                matchList.emplace_back(match->second);
            }
        }
        ++cascadeIndex;
    }
    return matches;
}